

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

string * __thiscall
slang::CommandLine::addRenameCommand_abi_cxx11_
          (string *__return_storage_ptr__,CommandLine *this,string_view value)

{
  size_type __n;
  size_type sVar1;
  mapped_type *this_00;
  v9 *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  format_args args;
  string_view fmt;
  allocator<char> local_161;
  key_type local_160;
  basic_string_view<char,_std::char_traits<char>_> local_140;
  undefined1 local_130 [8];
  string_view slangName;
  char *local_118;
  size_t lastCommaIndex;
  size_t firstCommaIndex;
  CommandLine *this_local;
  string_view value_local;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_d8 [3];
  undefined1 local_c0 [16];
  v9 *local_b0;
  char *local_a8;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_a0;
  char *local_98 [2];
  string *local_88;
  char *local_80;
  char **local_78;
  char *local_70;
  char **local_68;
  char **local_60;
  v9 *local_58;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  **local_40;
  undefined1 *local_38;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  **local_30;
  undefined8 local_28;
  undefined1 *local_20;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  **local_18;
  char *local_10;
  
  value_local._M_len = (size_t)value._M_str;
  this_local = (CommandLine *)value._M_len;
  __n = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                  ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,',',0);
  this_01 = (v9 *)0x2c;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_of
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,',',
                     0xffffffffffffffff);
  if ((__n == 0xffffffffffffffff) || (__n != sVar1)) {
    local_78 = &slangName._M_str;
    local_80 = "missing or extra comma in argument \'{}\'";
    local_70 = "missing or extra comma in argument \'{}\'";
    slangName._M_str = "missing or extra comma in argument \'{}\'";
    local_68 = local_78;
    std::char_traits<char>::length("missing or extra comma in argument \'{}\'");
    local_10 = local_80;
    local_98[0] = slangName._M_str;
    local_a0 = (format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                *)&this_local;
    local_60 = local_98;
    local_b0 = (v9 *)slangName._M_str;
    local_a8 = local_118;
    local_88 = __return_storage_ptr__;
    local_58 = local_b0;
    local_d8[0] = ::fmt::v9::
                  make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,std::basic_string_view<char,std::char_traits<char>>&>
                            (local_a0,this_01,
                             (basic_string_view<char,_std::char_traits<char>_> *)
                             __return_storage_ptr__);
    local_38 = local_c0;
    local_40 = local_d8;
    local_28 = 0xd;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_40;
    fmt.size_ = 0xd;
    fmt.data_ = local_a8;
    local_30 = local_40;
    local_20 = local_38;
    local_18 = local_40;
    ::fmt::v9::vformat_abi_cxx11_(__return_storage_ptr__,local_b0,fmt,args);
  }
  else {
    _local_130 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,__n + 1,
                            0xffffffffffffffff);
    local_140 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,0,__n);
    this_local = (CommandLine *)local_140._M_len;
    value_local._M_len = (size_t)local_140._M_str;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_160,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
               &local_161);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->cmdRename,&local_160);
    std::__cxx11::string::operator=
              ((string *)this_00,(basic_string_view<char,_std::char_traits<char>_> *)local_130);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator(&local_161);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CommandLine::addRenameCommand(string_view value) {
    const size_t firstCommaIndex = value.find_first_of(',');
    const size_t lastCommaIndex = value.find_last_of(',');
    if (firstCommaIndex == string_view::npos || firstCommaIndex != lastCommaIndex)
        return fmt::format("missing or extra comma in argument '{}'", value);

    const string_view slangName = value.substr(firstCommaIndex + 1);
    value = value.substr(0, firstCommaIndex);
    cmdRename[std::string(value)] = slangName;
    return {};
}